

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::ninjaCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  cmLocalGenerator *pcVar1;
  allocator local_9;
  
  pcVar1 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pcVar1 == (cmLocalGenerator *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ninja",&local_9);
  }
  else {
    cmOutputConverter::ConvertToOutputFormat
              (__return_storage_ptr__,&pcVar1->super_cmOutputConverter,&this->NinjaCommand,SHELL);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaCmd() const
{
  cmLocalGenerator* lgen = this->LocalGenerators[0];
  if (lgen) {
    return lgen->ConvertToOutputFormat(this->NinjaCommand,
                                       cmOutputConverter::SHELL);
  }
  return "ninja";
}